

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

BigNum * operator+(BigNum *__return_storage_ptr__,BigNum *a,BigNum *b)

{
  pointer piVar1;
  pointer piVar2;
  int iVar3;
  int iVar4;
  int i;
  int iVar5;
  int iVar6;
  long lVar7;
  BigNum *this;
  int rest;
  int sum;
  BigNum local_130;
  BigNum local_110;
  BigNum local_f0;
  BigNum local_d0;
  BigNum local_b0;
  BigNum local_90;
  BigNum local_70;
  BigNum local_50;
  
  BigNum::BigNum(__return_storage_ptr__);
  rest = 0;
  if (a->sign == b->sign) {
    iVar3 = a->length;
    iVar4 = b->length;
    if (iVar3 < iVar4) {
      iVar6 = iVar3;
      iVar3 = iVar4;
      for (iVar5 = 0; iVar5 < iVar3 - iVar6; iVar5 = iVar5 + 1) {
        sum = 0;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&a->digits,&sum);
        iVar3 = b->length;
        iVar6 = a->length;
      }
      a->length = iVar3;
      iVar4 = b->length;
    }
    if (iVar4 < iVar3) {
      for (iVar6 = 0; iVar6 < iVar3 - iVar4; iVar6 = iVar6 + 1) {
        sum = 0;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&b->digits,&sum);
        iVar3 = a->length;
        iVar4 = b->length;
      }
      b->length = iVar3;
    }
    iVar3 = 0;
    for (lVar7 = 0; iVar4 = a->length, lVar7 < iVar4; lVar7 = lVar7 + 1) {
      piVar1 = (a->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = (b->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      sum = (piVar2[lVar7] + piVar1[lVar7] + iVar3) % 10;
      iVar3 = (iVar3 + piVar1[lVar7] + piVar2[lVar7]) / 10;
      rest = iVar3;
      std::vector<int,_std::allocator<int>_>::push_back(&__return_storage_ptr__->digits,&sum);
    }
    __return_storage_ptr__->sign = a->sign;
    __return_storage_ptr__->length = iVar4;
    if (0 < iVar3) {
      std::vector<int,_std::allocator<int>_>::push_back(&__return_storage_ptr__->digits,&rest);
      __return_storage_ptr__->length = __return_storage_ptr__->length + 1;
    }
  }
  else {
    if (a->sign == false) {
      BigNum::BigNum(&local_f0,b);
      abs((int)&local_d0);
      BigNum::BigNum(&local_130,a);
      abs((int)&local_110);
      operator-((BigNum *)&sum,&local_d0,&local_110);
      BigNum::operator=(__return_storage_ptr__,(BigNum *)&sum);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&sum);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_110);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_130);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_d0);
      this = &local_f0;
    }
    else {
      BigNum::BigNum(&local_70,a);
      abs((int)&local_50);
      BigNum::BigNum(&local_b0,b);
      abs((int)&local_90);
      operator-((BigNum *)&sum,&local_50,&local_90);
      BigNum::operator=(__return_storage_ptr__,(BigNum *)&sum);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&sum);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_b0);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_50);
      this = &local_70;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)this);
  }
  return __return_storage_ptr__;
}

Assistant:

BigNum operator +(BigNum a, BigNum b){
    BigNum c = BigNum();
    int rest = 0;
    if (a.sign == b.sign) {
        if (a.length < b.length) {
            for (int i = 0; i < b.length - a.length; i++) {
                a.digits.push_back(0);
            }
            a.length = b.length;
        }
        if (b.length < a.length) {
            for (int i = 0; i < a.length - b.length; i++) {
                b.digits.push_back(0);
            }
            b.length = a.length;
        }
        for (int i = 0; i < a.length; i++) {
            int sum = (a.digits[i] + b.digits[i] + rest) % 10;
            rest = (a.digits[i] + b.digits[i] + rest) / 10;
            c.digits.push_back(sum);
        }
        c.sign = a.sign;
        c.length = a.length;
        if (rest > 0) {
            c.digits.push_back(rest);
            c.length++;
        }
    }
    else {
        if (a.sign){
            c = abs(a) - abs(b);
        }
        else {
            c = abs(b) - abs(a);
        }

    }
    return c;
}